

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<long_double>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  int *piVar1;
  _Alloc_hider _Var2;
  int_type iVar3;
  int_type iVar4;
  int iVar5;
  long *plVar6;
  ios_info *this_00;
  uint64_t uVar7;
  ulong uVar8;
  int_type iVar9;
  streambuf_type *psVar10;
  ulong uVar11;
  streambuf_type *psVar12;
  bool bVar13;
  iter_type iVar14;
  string_type tmp;
  cast_type value;
  
  psVar12 = end._M_sbuf;
  psVar10 = in._M_sbuf;
  iVar4 = in._M_c;
  plVar6 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                  0xffffffffffffffff);
  iVar9 = end._M_c;
  if (plVar6 != (long *)0x0) {
    this_00 = ios_info::get(ios);
    uVar7 = ios_info::display_flags(this_00);
    if ((uVar7 != 0) &&
       (formatter<wchar_t>::create((formatter<wchar_t> *)&tmp,ios,&this->loc_,&this->enc_),
       _Var2 = tmp._M_dataplus, tmp._M_dataplus._M_p != (pointer)0x0)) {
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = L'\0';
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      std::__cxx11::wstring::reserve((ulong)&tmp);
LAB_00197536:
      iVar3 = iVar4;
      if (iVar4 == 0xffffffff && psVar10 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
          iVar3 = **(int_type **)(psVar10 + 0x10);
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (iVar3 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if (psVar12 == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
        if ((iVar9 == 0xffffffff) == (iVar3 == 0xffffffff)) goto LAB_001977b3;
      }
      else {
        if (*(int **)(psVar12 + 0x10) < *(int **)(psVar12 + 0x18)) {
          iVar5 = **(int **)(psVar12 + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
        }
        if (iVar5 == -1) {
          psVar12 = (streambuf_type *)0x0;
          if (iVar3 == 0xffffffff) goto LAB_001977b3;
        }
        else if (iVar3 != 0xffffffff) goto LAB_001977b3;
      }
      iVar3 = iVar4;
      if (psVar10 != (streambuf_type *)0x0 && iVar4 == 0xffffffff) {
        if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
          iVar3 = **(int_type **)(psVar10 + 0x10);
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (iVar3 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if (iVar3 != 0x7f && 0x1f < iVar3 - 1) goto LAB_001977b3;
      if (*(ulong *)(psVar10 + 0x10) < *(ulong *)(psVar10 + 0x18)) {
        *(ulong *)(psVar10 + 0x10) = *(ulong *)(psVar10 + 0x10) + 4;
        iVar4 = 0xffffffff;
      }
      else {
        iVar4 = 0xffffffff;
        (**(code **)(*(long *)psVar10 + 0x50))(psVar10);
      }
      goto LAB_00197536;
    }
  }
  iVar14 = (iter_type)
           std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::do_get
                     (this,psVar10,iVar4,psVar12,end._8_8_ & 0xffffffff,ios,err,val);
  return iVar14;
LAB_001977b3:
  if (0xfff < tmp._M_string_length) goto LAB_001977c2;
  iVar3 = iVar4;
  if (iVar4 == 0xffffffff && psVar10 != (streambuf_type *)0x0) {
    if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
      iVar3 = **(int_type **)(psVar10 + 0x10);
    }
    else {
      iVar3 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    if (iVar3 == 0xffffffff) {
      psVar10 = (streambuf_type *)0x0;
    }
  }
  if (psVar12 == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
    if ((iVar9 == 0xffffffff) == (iVar3 == 0xffffffff)) goto LAB_001977c2;
  }
  else {
    if (*(int **)(psVar12 + 0x10) < *(int **)(psVar12 + 0x18)) {
      iVar5 = **(int **)(psVar12 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
    }
    if (iVar5 == -1) {
      psVar12 = (streambuf_type *)0x0;
      if (iVar3 == 0xffffffff) goto LAB_001977c2;
    }
    else if (iVar3 != 0xffffffff) goto LAB_001977c2;
  }
  if (psVar10 == (streambuf_type *)0x0 || iVar4 != 0xffffffff) {
LAB_0019771b:
    if (iVar4 == 10) goto LAB_001977c2;
  }
  else {
    if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
      iVar4 = **(int_type **)(psVar10 + 0x10);
    }
    else {
      iVar4 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    if (iVar4 != 0xffffffff) goto LAB_0019771b;
    psVar10 = (streambuf_type *)0x0;
  }
  piVar1 = *(int **)(psVar10 + 0x10);
  if (piVar1 < *(int **)(psVar10 + 0x18)) {
    iVar5 = *piVar1;
    *(int **)(psVar10 + 0x10) = piVar1 + 1;
  }
  else {
    iVar5 = (**(code **)(*(long *)psVar10 + 0x50))(psVar10);
  }
  if ((iVar5 == -1) && (*(ulong *)(psVar10 + 0x18) <= *(ulong *)(psVar10 + 0x10))) {
    (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
  }
  iVar4 = 0xffffffff;
  std::__cxx11::wstring::push_back((wchar_t)&tmp);
  goto LAB_001977b3;
LAB_001977c2:
  uVar8 = (**(code **)(*(long *)_Var2._M_p + 0x28))(_Var2._M_p,&tmp,&value);
  uVar11 = tmp._M_string_length;
  if (uVar8 == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = (longdouble)value;
  }
  for (; uVar8 < uVar11; uVar11 = uVar11 - 1) {
    std::wistream::putback((wchar_t)plVar6);
  }
  psVar10 = *(streambuf_type **)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0xe8);
  if (psVar10 == (streambuf_type *)0x0) {
    bVar13 = true;
    psVar10 = (streambuf_type *)0x0;
  }
  else {
    if (*(int **)(psVar10 + 0x10) < *(int **)(psVar10 + 0x18)) {
      iVar5 = **(int **)(psVar10 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    bVar13 = iVar5 == -1;
    if (bVar13) {
      psVar10 = (streambuf_type *)0x0;
    }
  }
  if (psVar12 == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
    if ((iVar9 != 0xffffffff) == bVar13) goto LAB_001978c1;
  }
  else {
    if (*(int **)(psVar12 + 0x10) < *(int **)(psVar12 + 0x18)) {
      iVar5 = **(int **)(psVar12 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
    }
    if (bVar13 != (iVar5 == -1)) goto LAB_001978c1;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_001978c1:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*(long *)_Var2._M_p + 8))(_Var2._M_p);
  iVar14._8_8_ = 0xffffffff;
  iVar14._M_sbuf = psVar10;
  return iVar14;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }